

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O1

int h2o_cache_set(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash,
                 h2o_iovec_t value)

{
  h2o_linklist_t *phVar1;
  kh_cache_t *h;
  khint32_t *pkVar2;
  size_t sVar3;
  st_h2o_linklist_t *psVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  khint_t kVar8;
  size_t sVar9;
  h2o_cache_ref_t *phVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  khint_t kVar14;
  uint uVar15;
  uint uVar16;
  khint_t kVar17;
  ulong uVar18;
  int iVar19;
  h2o_iovec_t hVar20;
  
  if (keyhash == 0) {
    keyhash = 0;
    for (sVar9 = key.len; sVar9 != 0; sVar9 = sVar9 - 1) {
      keyhash = (uint)(byte)key.base[sVar9 - 1] + keyhash * 0x1f;
    }
  }
  phVar10 = (h2o_cache_ref_t *)malloc(0x60);
  if (phVar10 == (h2o_cache_ref_t *)0x0) {
    h2o__fatal(
              "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
              );
  }
  hVar20 = h2o_strdup((h2o_mem_pool_t *)0x0,key.base,key.len);
  (phVar10->value).base = value.base;
  (phVar10->value).len = value.len;
  phVar10->key = hVar20;
  phVar10->keyhash = keyhash;
  phVar10->at = now;
  phVar10->_requested_early_update = 0;
  (phVar10->_lru_link).next = (st_h2o_linklist_t *)0x0;
  (phVar10->_lru_link).prev = (st_h2o_linklist_t *)0x0;
  (phVar10->_age_link).next = (st_h2o_linklist_t *)0x0;
  (phVar10->_age_link).prev = (st_h2o_linklist_t *)0x0;
  phVar10->_refcnt = 1;
  if ((cache->flags & 1) != 0) {
    pthread_mutex_lock((pthread_mutex_t *)&cache->mutex);
  }
  h = cache->table;
  uVar15 = h->n_buckets;
  uVar6 = 0;
  if (uVar15 != 0) {
    uVar12 = phVar10->keyhash & uVar15 - 1;
    pkVar2 = h->flags;
    iVar19 = 1;
    uVar16 = uVar12;
    do {
      uVar13 = pkVar2[uVar16 >> 4];
      bVar11 = (char)uVar16 * '\x02' & 0x1e;
      uVar6 = uVar13 >> bVar11;
      if ((uVar6 & 2) != 0) {
LAB_00125a7c:
        uVar6 = uVar16;
        if ((uVar13 >> bVar11 & 3) != 0) {
          uVar6 = uVar15;
        }
        break;
      }
      if ((uVar6 & 1) == 0) {
        sVar3 = (h->keys[uVar16]->key).len;
        if ((sVar3 == (phVar10->key).len) &&
           (iVar7 = bcmp((h->keys[uVar16]->key).base,(phVar10->key).base,sVar3), iVar7 == 0))
        goto LAB_00125a7c;
      }
      uVar16 = uVar16 + iVar19 & uVar15 - 1;
      iVar19 = iVar19 + 1;
      uVar6 = uVar15;
    } while (uVar16 != uVar12);
  }
  phVar1 = &phVar10->_lru_link;
  if (uVar6 != uVar15) {
    iVar19 = 1;
    erase_ref(cache,uVar6,1);
    cache->table->keys[uVar6] = phVar10;
    goto LAB_00125c56;
  }
  if (h->n_occupied < h->upper_bound) {
LAB_00125afc:
    kVar14 = h->n_buckets;
    uVar15 = phVar10->keyhash & kVar14 - 1;
    uVar18 = (ulong)uVar15;
    pkVar2 = h->flags;
    if ((pkVar2[uVar15 >> 4] >> ((char)uVar15 * '\x02' & 0x1fU) & 2) == 0) {
      iVar19 = 1;
      uVar6 = uVar15;
      kVar17 = kVar14;
      do {
        uVar16 = pkVar2[uVar6 >> 4];
        uVar13 = uVar6 * 2 & 0x1e;
        uVar12 = uVar16 >> (sbyte)uVar13;
        kVar8 = kVar14;
        if ((uVar12 & 2) != 0) break;
        if ((uVar12 & 1) == 0) {
          sVar3 = (h->keys[uVar6]->key).len;
          if ((sVar3 == (phVar10->key).len) &&
             (iVar7 = bcmp((h->keys[uVar6]->key).base,(phVar10->key).base,sVar3), iVar7 == 0))
          break;
        }
        if ((uVar16 >> uVar13 & 1) != 0) {
          kVar17 = uVar6;
        }
        uVar6 = uVar6 + iVar19 & kVar14 - 1;
        iVar19 = iVar19 + 1;
        kVar8 = kVar17;
      } while (uVar6 != uVar15);
      uVar18 = (ulong)kVar8;
      if (kVar8 == kVar14) {
        if (kVar17 == kVar14) {
          kVar17 = uVar6;
        }
        if ((pkVar2[uVar6 >> 4] >> ((char)uVar6 * '\x02' & 0x1fU) & 2) == 0) {
          kVar17 = uVar6;
        }
        uVar18 = (ulong)kVar17;
      }
    }
    uVar5 = uVar18 >> 4;
    bVar11 = (char)uVar18 * '\x02' & 0x1e;
    if ((pkVar2[uVar5] >> bVar11 & 2) == 0) {
      iVar19 = 0;
      if ((pkVar2[uVar5] >> bVar11 & 1) != 0) {
        h->keys[uVar18] = phVar10;
        h->flags[uVar5] = h->flags[uVar5] & ~(3 << bVar11);
        h->size = h->size + 1;
        iVar19 = 0;
      }
      goto LAB_00125c56;
    }
    h->keys[uVar18] = phVar10;
    h->flags[uVar5] = h->flags[uVar5] & ~(3 << bVar11);
    h->size = h->size + 1;
    h->n_occupied = h->n_occupied + 1;
  }
  else {
    if (h->size * 2 < uVar15) {
      kVar14 = uVar15 - 1;
    }
    else {
      kVar14 = uVar15 + 1;
    }
    iVar19 = kh_resize_cache(h,kVar14);
    if (-1 < iVar19) goto LAB_00125afc;
  }
  iVar19 = 0;
LAB_00125c56:
  if (phVar1->next == (st_h2o_linklist_t *)0x0) {
    psVar4 = (cache->lru).prev;
    (phVar10->_lru_link).prev = psVar4;
    (phVar10->_lru_link).next = &cache->lru;
    psVar4->next = phVar1;
    ((phVar10->_lru_link).next)->prev = phVar1;
    if ((phVar10->_age_link).next == (st_h2o_linklist_t *)0x0) {
      psVar4 = (cache->age).prev;
      (phVar10->_age_link).prev = psVar4;
      (phVar10->_age_link).next = &cache->age;
      psVar4->next = &phVar10->_age_link;
      ((phVar10->_age_link).next)->prev = &phVar10->_age_link;
      cache->size = cache->size + (phVar10->value).len;
      purge(cache,now);
      if ((cache->flags & 1) != 0) {
        pthread_mutex_unlock((pthread_mutex_t *)&cache->mutex);
      }
      return iVar19;
    }
  }
  __assert_fail("!h2o_linklist_is_linked(node)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/linklist.h"
                ,0x59,"void h2o_linklist_insert(h2o_linklist_t *, h2o_linklist_t *)");
}

Assistant:

int h2o_cache_set(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash, h2o_iovec_t value)
{
    h2o_cache_ref_t *newref;
    khiter_t iter;
    int existed;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);

    /* create newref */
    newref = h2o_mem_alloc(sizeof(*newref));
    *newref = (h2o_cache_ref_t){h2o_strdup(NULL, key.base, key.len), keyhash, now, value, 0, {NULL}, {NULL}, 1};

    lock_cache(cache);

    /* set or replace the named value */
    iter = kh_get(cache, cache->table, newref);
    if (iter != kh_end(cache->table)) {
        erase_ref(cache, iter, 1);
        kh_key(cache->table, iter) = newref;
        existed = 1;
    } else {
        int unused;
        kh_put(cache, cache->table, newref, &unused);
        existed = 0;
    }
    h2o_linklist_insert(&cache->lru, &newref->_lru_link);
    h2o_linklist_insert(&cache->age, &newref->_age_link);
    cache->size += newref->value.len;

    purge(cache, now);

    unlock_cache(cache);

    return existed;
}